

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattice.c
# Opt level: O3

void WebRtcIsac_NormLatticeFilterMa
               (int orderCoef,float *stateF,float *stateG,float *lat_in,double *filtcoeflo,
               double *lat_out)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  double dVar5;
  ulong uVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  undefined1 *puVar10;
  uint uVar11;
  long lVar12;
  float *__src;
  float fVar13;
  float fVar14;
  float fVar15;
  float cth [12];
  float inv_cth [12];
  float sth [12];
  double a [13];
  float f [13] [40];
  float g [13] [40];
  float local_1178 [12];
  float afStack_1148 [12];
  float local_1118 [12];
  double local_10e8;
  undefined1 local_10e0 [104];
  float local_1078 [41];
  undefined1 local_fd4 [1916];
  float local_858 [41];
  undefined1 local_7b4 [1924];
  
  uVar11 = orderCoef + 1;
  lVar12 = 0;
  do {
    __src = lat_in + lVar12 * 0x28;
    local_10e8 = 1.0;
    memcpy(local_10e0,filtcoeflo + lVar12 * (int)uVar11 + 1,(long)orderCoef * 8);
    WebRtcIsac_Dir2Lat(&local_10e8,orderCoef,local_1118,local_1178);
    fVar13 = (float)filtcoeflo[lVar12 * (int)uVar11];
    if (orderCoef < 1) {
      memcpy(local_1078,__src,0xa0);
      memcpy(local_858,__src,0xa0);
    }
    else {
      uVar6 = 0;
      do {
        fVar13 = fVar13 * local_1178[uVar6];
        afStack_1148[uVar6] = 1.0 / local_1178[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)orderCoef != uVar6);
      memcpy(local_1078,__src,0xa0);
      memcpy(local_858,__src,0xa0);
      if (0 < orderCoef) {
        lVar7 = 0x28;
        lVar9 = 0;
        fVar14 = local_1078[0];
        do {
          fVar1 = *(float *)((long)local_1118 + lVar9);
          fVar2 = *(float *)((long)stateG + lVar9);
          fVar14 = (fVar1 * fVar2 + fVar14) * *(float *)((long)afStack_1148 + lVar9);
          local_1078[lVar7] = fVar14;
          local_858[lVar7] = fVar2 * *(float *)((long)local_1178 + lVar9) + fVar1 * fVar14;
          lVar9 = lVar9 + 4;
          lVar7 = lVar7 + 0x28;
        } while ((ulong)uVar11 * 4 + -4 != lVar9);
        if (0 < orderCoef) {
          uVar6 = 0;
          puVar8 = local_fd4;
          puVar10 = local_7b4;
          do {
            fVar14 = afStack_1148[uVar6];
            fVar1 = local_1118[uVar6];
            fVar2 = local_1178[uVar6];
            uVar6 = uVar6 + 1;
            lVar7 = -0x27;
            do {
              fVar3 = *(float *)(puVar10 + lVar7 * 4 + -8);
              fVar15 = (fVar1 * fVar3 + *(float *)(puVar8 + lVar7 * 4 + -4)) * fVar14;
              *(float *)(puVar8 + lVar7 * 4 + 0x9c) = fVar15;
              *(float *)(puVar10 + lVar7 * 4 + 0x9c) = fVar3 * fVar2 + fVar15 * fVar1;
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0);
            puVar10 = puVar10 + 0xa0;
            puVar8 = puVar8 + 0xa0;
          } while (uVar6 != (uint)orderCoef);
        }
      }
    }
    lVar7 = 0;
    do {
      dVar5 = (double)((float)((ulong)*(undefined8 *)(local_1078 + (long)orderCoef * 0x28 + lVar7)
                              >> 0x20) * fVar13);
      auVar4._8_4_ = SUB84(dVar5,0);
      auVar4._0_8_ = (double)((float)*(undefined8 *)(local_1078 + (long)orderCoef * 0x28 + lVar7) *
                             fVar13);
      auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])(lat_out + lVar7) = auVar4;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x28);
    if (-1 < orderCoef) {
      lVar7 = 0x27;
      uVar6 = 0;
      do {
        stateF[uVar6] = local_1078[lVar7];
        stateG[uVar6] = local_858[lVar7];
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x28;
      } while (uVar11 != uVar6);
    }
    lVar12 = lVar12 + 1;
    lat_out = lat_out + 0x28;
  } while (lVar12 != 6);
  return;
}

Assistant:

void WebRtcIsac_NormLatticeFilterMa(int orderCoef,
                                     float *stateF,
                                     float *stateG,
                                     float *lat_in,
                                     double *filtcoeflo,
                                     double *lat_out)
{
  int n,k,i,u,temp1;
  int ord_1 = orderCoef+1;
  float sth[MAX_AR_MODEL_ORDER];
  float cth[MAX_AR_MODEL_ORDER];
  float inv_cth[MAX_AR_MODEL_ORDER];
  double a[MAX_AR_MODEL_ORDER+1];
  float f[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN], g[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN];
  float gain1;

  for (u=0;u<SUBFRAMES;u++)
  {
    /* set the Direct Form coefficients */
    temp1 = u*ord_1;
    a[0] = 1;
    memcpy(a+1, filtcoeflo+temp1+1, sizeof(double) * (ord_1-1));

    /* compute lattice filter coefficients */
    WebRtcIsac_Dir2Lat(a,orderCoef,sth,cth);

    /* compute the gain */
    gain1 = (float)filtcoeflo[temp1];
    for (k=0;k<orderCoef;k++)
    {
      gain1 *= cth[k];
      inv_cth[k] = 1/cth[k];
    }

    /* normalized lattice filter */
    /*****************************/

    /* initial conditions */
    for (i=0;i<HALF_SUBFRAMELEN;i++)
    {
      f[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
      g[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
    }

    /* get the state of f&g for the first input, for all orders */
    for (i=1;i<ord_1;i++)
    {
      f[i][0] = inv_cth[i-1]*(f[i-1][0] + sth[i-1]*stateG[i-1]);
      g[i][0] = cth[i-1]*stateG[i-1] + sth[i-1]* f[i][0];
    }

    /* filtering */
    for(k=0;k<orderCoef;k++)
    {
      for(n=0;n<(HALF_SUBFRAMELEN-1);n++)
      {
        f[k+1][n+1] = inv_cth[k]*(f[k][n+1] + sth[k]*g[k][n]);
        g[k+1][n+1] = cth[k]*g[k][n] + sth[k]* f[k+1][n+1];
      }
    }

    for(n=0;n<HALF_SUBFRAMELEN;n++)
    {
      lat_out[n + u * HALF_SUBFRAMELEN] = gain1 * f[orderCoef][n];
    }

    /* save the states */
    for (i=0;i<ord_1;i++)
    {
      stateF[i] = f[i][HALF_SUBFRAMELEN-1];
      stateG[i] = g[i][HALF_SUBFRAMELEN-1];
    }
    /* process next frame */
  }

  return;
}